

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::to_render_mode(Application *this)

{
  Scene *pSVar1;
  _Rb_tree_node_base *p_Var2;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 1) {
    DynamicScene::Scene::triangulateSelection(this->scene);
    set_up_pathtracer(this);
    PathTracer::stop(this->pathtracer);
    PathTracer::start_raytracing(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 1;
    this->isGhosted = false;
    pSVar1 = this->scene;
    for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *(undefined1 *)(*(long *)(p_Var2 + 1) + 0xe9) = 0;
    }
  }
  return;
}

Assistant:

void Application::to_render_mode() {
  if (mode == RENDER_MODE) return;
  scene->triangulateSelection();
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_raytracing();
  mode = RENDER_MODE;
  setGhosted(false);
}